

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::SetWellKnownHostTypeId
          (ThreadContext *this,WellKnownHostType wellKnownType,TypeId typeId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((int)wellKnownType < 2) {
    if (WellKnownHostType_Last < wellKnownType) {
      return;
    }
    (this->super_ThreadContextInfo).wellKnownHostTypeIds[wellKnownType] = typeId;
    if (wellKnownType != WellKnownHostType_HTMLAllCollection ||
        this->m_remoteThreadContextInfo == (PTHREADCONTEXT_HANDLE)0x0) {
      return;
    }
    SetWellKnownHostTypeId();
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                     ,0x8cc,"(wellKnownType <= WellKnownHostType_Last)",
                     "ThreadContext::SetWellKnownHostTypeId called on unknown type");
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ThreadContext::SetWellKnownHostTypeId(WellKnownHostType wellKnownType, Js::TypeId typeId)
{
    AssertMsg(wellKnownType <= WellKnownHostType_Last, "ThreadContext::SetWellKnownHostTypeId called on unknown type");

    if (wellKnownType >= 0 && wellKnownType <= WellKnownHostType_Last)
    {
        this->wellKnownHostTypeIds[wellKnownType] = typeId;
#if ENABLE_NATIVE_CODEGEN
        // The jit server really only needs to know about WellKnownHostType_HTMLAllCollection
        if (this->m_remoteThreadContextInfo && wellKnownType == WellKnownHostType_HTMLAllCollection)
        {
            HRESULT hr = JITManager::GetJITManager()->SetWellKnownHostTypeId(this->m_remoteThreadContextInfo, (int)typeId);
            JITManager::HandleServerCallResult(hr, RemoteCallType::StateUpdate);
        }
#endif
    }
}